

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-hmac-impl.c
# Opt level: O3

int ndn_lite_default_hmacprng
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t output_size,
              uint8_t *seed_value,uint32_t seed_size,uint8_t *additional_value,
              uint32_t additional_size)

{
  int iVar1;
  int iVar2;
  undefined1 local_190 [8];
  tc_hmac_prng_struct h;
  uint8_t min_seed [32];
  
  iVar1 = tc_hmac_prng_init((TCHmacPrng_t)local_190,input_value,input_size);
  iVar2 = -0x1c;
  if (iVar1 == 1) {
    if (seed_size < 0x20) {
      h.countdown = 0;
      h._308_4_ = 0;
      memcpy(&h.countdown,seed_value,(ulong)seed_size);
      iVar1 = tc_hmac_prng_reseed((TCHmacPrng_t)local_190,(uint8_t *)&h.countdown,0x20,
                                  additional_value,additional_size);
    }
    else {
      iVar1 = tc_hmac_prng_reseed((TCHmacPrng_t)local_190,seed_value,seed_size,additional_value,
                                  additional_size);
    }
    if (iVar1 == 1) {
      iVar1 = tc_hmac_prng_generate(output_value,output_size,(TCHmacPrng_t)local_190);
      iVar2 = -0x19;
      if (iVar1 == 1) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
ndn_lite_default_hmacprng(const uint8_t* input_value, uint32_t input_size,
                          uint8_t* output_value, uint32_t output_size,
                          const uint8_t* seed_value, uint32_t seed_size,
                          const uint8_t* additional_value, uint32_t additional_size)
{
  struct tc_hmac_prng_struct h;
  if (tc_hmac_prng_init(&h, input_value, input_size) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }

  if (seed_size < 32) {
    uint8_t min_seed[32] = {0};
    memcpy(min_seed, seed_value, seed_size);
    if (tc_hmac_prng_reseed(&h, min_seed, sizeof(min_seed),
                            additional_value, additional_size) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_INIT_FAILURE;
    }
    if (tc_hmac_prng_generate(output_value, output_size, &h) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_CRYPTO_ALGO_FAILURE;
    }
  }
  else {
    if (tc_hmac_prng_reseed(&h, seed_value, seed_size,
                            additional_value, additional_size) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_INIT_FAILURE;
    }
    if (tc_hmac_prng_generate(output_value, output_size, &h) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_CRYPTO_ALGO_FAILURE;
    }
  }
  return NDN_SUCCESS;
}